

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O2

bool __thiscall OpenGliderConnection::ProcessFetchedData(OpenGliderConnection *this)

{
  double dVar1;
  double dVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  FlarmAircraftTy FVar5;
  time_t tVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  mapped_type *this_00;
  long lVar11;
  FlarmAircraftTy _acTy;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tok;
  string sMarker;
  FDKeyTy fdKey;
  unique_lock<std::mutex> mapFdLock;
  positionTy local_368;
  string acFilter;
  FDDynamicData dyn;
  FDStaticData stat;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  positionTy viewPos;
  char buf [100];
  
  DataRefs::GetDebugAcFilter_abi_cxx11_(&acFilter,&dataRefs);
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos != 0) {
    tVar6 = time((time_t *)0x0);
    lVar7 = lround(dataRefs.chTsOffset);
    DataRefs::GetViewPos();
    pcVar8 = strstr((this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,"<m a=\"");
    for (; pcVar8 != (char *)0x0; pcVar8 = strstr(pcVar8,"<m a=\"")) {
      pcVar8 = pcVar8 + 6;
      pcVar9 = strstr(pcVar8,"\"/>");
      if (pcVar9 == (char *)0x0) {
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                 ,0x122,"ProcessFetchedData",logERR,
                 "OGN response malformed, end of XML element missing: %s",pcVar8);
        }
        break;
      }
      sMarker._M_dataplus._M_p = (pointer)&sMarker.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sMarker,pcVar8,pcVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stat,",",(allocator<char> *)&dyn);
      str_tokenize(&tok,&sMarker,&stat.reg,false);
      std::__cxx11::string::~string((string *)&stat);
      if ((long)tok.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)tok.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x1c0) {
        if ((int)dataRefs.iLogLevel < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                 ,0x12a,"ProcessFetchedData",logERR,
                 "OGN response contains wrong number of fields: %s",sMarker._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tok);
        std::__cxx11::string::~string((string *)&sMarker);
        break;
      }
      lVar10 = std::__cxx11::stol(tok.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 6,(size_t *)0x0,10);
      lVar11 = -lVar10;
      if (0 < lVar10) {
        lVar11 = lVar10;
      }
      if (lVar11 < dataRefs.fdBufPeriod) {
        fdKey.eKeyType = KEY_UNKNOWN;
        fdKey.key._M_dataplus._M_p = (pointer)&fdKey.key.field_2;
        fdKey.key._M_string_length = 0;
        fdKey.key.field_2._M_local_buf[0] = '\0';
        fdKey.num = 0;
        stat.reg._M_dataplus._M_p = (pointer)&stat.reg.field_2;
        stat.reg._M_string_length = 0;
        stat.reg.field_2._M_local_buf[0] = '\0';
        stat.country._M_dataplus._M_p = (pointer)&stat.country.field_2;
        stat.country._M_string_length = 0;
        stat.country.field_2._M_local_buf[0] = '\0';
        stat.acTypeIcao._M_dataplus._M_p = (pointer)&stat.acTypeIcao.field_2;
        stat.acTypeIcao._M_string_length = 0;
        stat.acTypeIcao.field_2._M_local_buf[0] = '\0';
        stat.man._M_dataplus._M_p = (pointer)&stat.man.field_2;
        stat.man._M_string_length = 0;
        stat.man.field_2._M_local_buf[0] = '\0';
        stat.mdl._M_dataplus._M_p = (pointer)&stat.mdl.field_2;
        stat.mdl._M_string_length = 0;
        stat.mdl.field_2._M_local_buf[0] = '\0';
        stat.catDescr._M_dataplus._M_p = (pointer)&stat.catDescr.field_2;
        stat.catDescr._M_string_length = 0;
        stat.catDescr.field_2._M_local_buf[0] = '\0';
        stat.engType = -1;
        stat.engMount = -1;
        stat.year = 0;
        stat.mil = false;
        stat.pDoc8643 = (Doc8643 *)0x0;
        stat.call._M_dataplus._M_p = (pointer)&stat.call.field_2;
        stat.call._M_string_length = 0;
        stat.call.field_2._M_local_buf[0] = '\0';
        stat.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        stat.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        stat.stops.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        stat.flight._M_dataplus._M_p = (pointer)&stat.flight.field_2;
        stat.flight._M_string_length = 0;
        stat.flight.field_2._M_local_buf[0] = '\0';
        stat.slug._M_dataplus._M_p = (pointer)&stat.slug.field_2;
        stat.slug._M_string_length = 0;
        stat.slug.field_2._M_local_buf[0] = '\0';
        stat.op._M_dataplus._M_p = (pointer)&stat.op.field_2;
        stat.op._M_string_length = 0;
        stat.op.field_2._M_local_buf[0] = '\0';
        stat.opIcao._M_dataplus._M_p = (pointer)&stat.opIcao.field_2;
        stat.opIcao._M_string_length = 0;
        stat.opIcao.field_2._M_local_buf[0] = '\0';
        stat.bDataMaster = false;
        stat.bDataRoute = false;
        bVar4 = AcListLookup(this,tok.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0xc,&fdKey,&stat);
        if (bVar4) {
          if (acFilter._M_string_length != 0) {
            std::__cxx11::string::string((string *)&local_100,(string *)&acFilter);
            bVar4 = std::operator!=(&fdKey.key,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            if (bVar4) goto LAB_00172a92;
          }
          std::unique_lock<std::mutex>::unique_lock(&mapFdLock,&mapFdMutex);
          this_00 = std::
                    map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                    ::operator[](&mapFd,&fdKey);
          std::recursive_mutex::lock(&this_00->dataAccessMutex);
          std::unique_lock<std::mutex>::unlock(&mapFdLock);
          if ((this_00->acKey).key._M_string_length == 0) {
            LTFlightData::SetKey(this_00,&fdKey);
            FVar5 = std::__cxx11::stoi(tok.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 10,(size_t *)0x0,
                                       10);
            _acTy = FAT_STATIC_OBJ;
            if (FVar5 < FAT_STATIC_OBJ) {
              _acTy = FVar5;
            }
            if ((int)FVar5 < 0) {
              _acTy = FAT_UNKNOWN;
            }
            OGNGetAcTypeName(_acTy);
            std::__cxx11::string::assign((char *)&stat.catDescr);
            if (_acTy == FAT_STATIC_OBJ) {
              std::__cxx11::string::assign((char *)&stat.acTypeIcao);
              std::__cxx11::string::_M_assign((string *)&stat);
            }
            if (stat.acTypeIcao._M_string_length == 0) {
              OGNGetIcaoAcType_abi_cxx11_(_acTy);
              std::__cxx11::string::_M_assign((string *)&stat.acTypeIcao);
            }
            if (stat.mdl._M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)&stat.mdl);
            }
          }
          LTFlightData::FDDynamicData::FDDynamicData(&dyn);
          dyn.ts = (double)((lVar7 + tVar6) - lVar11);
          dyn.gnd = false;
          dyn.heading = std::__cxx11::stod(tok.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 7,
                                           (size_t *)0x0);
          dVar1 = std::__cxx11::stod(tok.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 8,(size_t *)0x0);
          dyn.spd = dVar1 * 0.5399568034557235;
          dyn.vsi = std::__cxx11::stod(tok.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 9,(size_t *)0x0);
          dyn.pChannel = (LTChannel *)this;
          dVar1 = std::__cxx11::stod(tok.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0);
          dVar2 = std::__cxx11::stod(tok.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
          local_368._alt =
               std::__cxx11::stod(tok.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4,(size_t *)0x0);
          local_368._ts = dyn.ts;
          local_368._head = dyn.heading;
          local_368._pitch = NAN;
          local_368._roll = NAN;
          local_368.mergeCount = 1;
          local_368.edgeIdx = 0xffffffffffffffff;
          local_368.f = (posFlagsTy)((ushort)local_368.f & 0x8000);
          local_368._lat = dVar1;
          local_368._lon = dVar2;
          snprintf(buf,100,"http://live.glidernet.org/#c=%.5f,%.5f&z=9&s=1",SUB84(dVar1,0));
          std::__cxx11::string::assign((char *)&stat.slug);
          dVar1 = CoordDistance(&local_368,&viewPos);
          LTFlightData::UpdateData(this_00,&stat,dVar1,DATREQU_NONE);
          bVar4 = positionTy::isNormal(&local_368,true);
          _Var3 = fdKey.key._M_dataplus;
          if (bVar4) {
            LTFlightData::AddDynData(this_00,&dyn,0,0,&local_368);
          }
          else if ((int)dataRefs.iLogLevel < 1) {
            positionTy::dbgTxt_abi_cxx11_(&local_120,&local_368);
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTOpenGlider.cpp"
                   ,0x189,"ProcessFetchedData",logDEBUG,"A/c %s reached invalid pos: %s",_Var3._M_p,
                   local_120._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_120);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
          std::unique_lock<std::mutex>::~unique_lock(&mapFdLock);
        }
LAB_00172a92:
        LTFlightData::FDStaticData::~FDStaticData(&stat);
        std::__cxx11::string::~string((string *)&fdKey.key);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tok);
      std::__cxx11::string::~string((string *)&sMarker);
    }
  }
  std::__cxx11::string::~string((string *)&acFilter);
  return true;
}

Assistant:

bool OpenGliderConnection::ProcessFetchedData ()
{
    char buf[100];

    // any a/c filter defined for debugging purposes?
    std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) return true;
    
    // We need current Zulu time to interpret the timestamp in the data
    const std::time_t tNow = std::time(nullptr) + std::lround(dataRefs.GetChTsOffset());
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();

    // Search for all markers in the response
    for (const char* sPos = strstr(netData, OGN_MARKER_BEGIN);
         sPos != nullptr;
         sPos = strstr(sPos, OGN_MARKER_BEGIN))
    {
        // increase sPos to actual begining of definition
        sPos += OGN_MARKER_BEGIN_LEN;
        
        // find the end of the marker definition
        const char* sEnd = strstr(sPos, OGN_MARKER_END);
        if (!sEnd) {
            LOG_MSG(logERR, ERR_OGN_XLM_END_MISSING, sPos);
            break;
        }
        
        // then this is the marker definition to work on
        const std::string sMarker (sPos, std::string::size_type(sEnd-sPos));
        std::vector<std::string> tok = str_tokenize(sMarker, ",", false);
        if (tok.size() != GNF_COUNT) {
            LOG_MSG(logERR, ERR_OGN_WRONG_NUM_FIELDS, sMarker.c_str());
            break;
        }
        
        // We skip records, which are outdated by the time they arrive
        const long age_s = std::abs(std::stol(tok[GNF_AGE_S]));
        if (age_s >= dataRefs.GetFdBufPeriod())
            continue;

        // Look up the device in the DDB / Aircraft list.
        // This also checks if the device wants to be tracked and sets the key accordingly
        LTFlightData::FDKeyTy fdKey;
        LTFlightData::FDStaticData stat;
        if (!AcListLookup(tok[GNF_FLARM_DEVICE_ID], fdKey, stat))
            continue;                   // device doesn't want to be tracked -> ignore!
        
        // key not matching a/c filter? -> skip it
        if ((!acFilter.empty() && (fdKey != acFilter)) )
            continue;
        
        try {
            // from here on access to fdMap guarded by a mutex
            // until FD object is inserted and updated
            std::unique_lock<std::mutex> mapFdLock (mapFdMutex);
            
            // get the fd object from the map
            // this fetches an existing or, if not existing, creates a new one
            LTFlightData& fd = mapFd[fdKey];
            
            // also get the data access lock once and for all
            // so following fetch/update calls only make quick recursive calls
            std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
            // now that we have the detail lock we can release the global one
            mapFdLock.unlock();

            // completely new? fill key fields and define static data
            // (for OGN some data we only define initially,
            //  ICAO a/c type derivation has a random element
            //  (if more than one ICAO type is defined))
            if ( fd.empty() ) {
                fd.SetKey(fdKey);
            
                // Aircraft type converted from Flarm AcftType
                const FlarmAircraftTy acTy = (FlarmAircraftTy)std::clamp<int>(std::stoi(tok[GNF_FLARM_ACFT_TYPE]),
                                                                              FAT_UNKNOWN, FAT_STATIC_OBJ);
                stat.catDescr   = OGNGetAcTypeName(acTy);

                // Static objects are always mapped to TWR, all others can be configured by the user
                if (acTy == FAT_STATIC_OBJ) {
                    stat.reg = stat.acTypeIcao = STATIC_OBJECT_TYPE;
                }
                
                // If we still have no accurate ICAO type then we need to fall back to some configured defaults
                if (stat.acTypeIcao.empty())
                    stat.acTypeIcao = OGNGetIcaoAcType(acTy);
                if (stat.mdl.empty())
                    stat.mdl        = stat.catDescr;
            }
                        
            // dynamic data
            {   // unconditional...block is only for limiting local variables
                LTFlightData::FDDynamicData dyn;
                
                // position time: zulu time is given in the data, but it is even easier
                //                when using the age, which is always given relative to the query time
                dyn.ts = double(tNow - age_s);
                
                // non-positional dynamic data
                dyn.gnd =               false;      // there is no GND indicator in OGN data
                dyn.heading =           std::stod(tok[GNF_TRK]);
                dyn.spd =               std::stod(tok[GNF_SPEED_KM_H]) * NM_per_KM;
                dyn.vsi =               std::stod(tok[GNF_VERT_M_S]);
                dyn.pChannel =          this;
                
                // position
                positionTy pos (std::stod(tok[GNF_LAT]),
                                std::stod(tok[GNF_LON]),
                                std::stod(tok[GNF_ALT_M]),
// no weather correction, OGN delivers geo altitude?   dataRefs.WeatherAltCorr_m(std::stod(tok[GNF_ALT_M])),
                                dyn.ts,
                                dyn.heading);
                pos.f.onGrnd = GND_UNKNOWN;         // there is no GND indicator in OGN data
                
                // Update the slug with current position
                snprintf(buf, sizeof(buf), OPGLIDER_CHECK_URL,
                         pos.lat(), pos.lon());
                stat.slug = buf;
                // Update static data
                fd.UpdateData(std::move(stat), pos.dist(viewPos));
                
                // position is rather important, we check for validity
                // (we do allow alt=NAN if on ground)
                if ( pos.isNormal(true) )
                    fd.AddDynData(dyn, 0, 0, &pos);
                else
                    LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
            }
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        }
    }
    
    // success
    return true;
}